

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_binary.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBinary
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          Precedence minPrecedence)

{
  Parser *this_00;
  byte bVar1;
  byte bVar2;
  Token *pTVar3;
  long *plVar4;
  undefined8 uVar5;
  bool bVar6;
  TokenType TVar7;
  mapped_type *pmVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  Position *__args_2;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  Expr *__args_5;
  Lexer *pLVar11;
  Parser *this_01;
  Expr *pEVar12;
  TokenType optype;
  long *local_b0;
  undefined1 local_a8 [24];
  Token *op;
  Expr *local_88;
  undefined8 local_80;
  undefined1 local_74;
  undefined1 local_70 [48];
  undefined1 local_40 [16];
  
  __args_5 = (Expr *)CONCAT71(in_register_00000011,minPrecedence);
  pLVar11 = (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
  this_00 = (Parser *)(local_70 + 0x18);
  local_a8._16_8_ = this;
  _local_74 = in_ECX;
  do {
    if (((ulong)*(TokenType *)&pLVar11->input < 0x2d) &&
       ((0x1000001c0006U >> ((ulong)*(TokenType *)&pLVar11->input & 0x3f) & 1) != 0)) {
LAB_001105ef:
      *(Expr **)local_a8._16_8_ =
           (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
            &__args_5->_vptr_Expr)->
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
       &__args_5->_vptr_Expr)->
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_a8._16_8_;
    }
    TVar7 = _getOperatorType((Token *)pLVar11);
    local_70._24_2_ = TVar7;
    pmVar8 = std::__detail::
             _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)OPERATORS_INFO,(key_type *)this_00);
    if ((pmVar8->
        super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>).
        super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
        super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl != BINARY)
    goto LAB_001105ef;
    bVar1 = (pmVar8->
            super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>).
            super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
    if (bVar1 < (byte)local_74) goto LAB_001105ef;
    op = (Token *)(lhs->_M_t).
                  super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
    optype = _getOperatorType(op);
    if (optype != TOK_OP_NONE) goto LAB_001101e3;
    while (bVar6 = Token::operator==((Token *)(lhs->_M_t).
                                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                              .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                              _M_head_impl[3].lexer,TOK_EOL), bVar6) {
LAB_001101e3:
      Lexer::next((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    }
    local_b0 = (long *)0x0;
    cVar9 = std::
            _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)TOKEN_BRACKETS,&optype);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_70._0_8_ = (Expr *)0x0;
      parsePrimary(this_00,(unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                            *)lhs);
      uVar5 = local_70._24_8_;
      plVar4 = local_b0;
      local_70._24_8_ = (long *)0x0;
      local_b0 = (long *)uVar5;
      if ((plVar4 != (long *)0x0) &&
         ((**(code **)(*plVar4 + 8))(), (long *)local_70._24_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_70._24_8_ + 8))();
      }
      local_70._24_8_ = (long *)0x0;
      std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
      ~unique_ptr((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                  local_70);
      if (local_b0 != (long *)0x0) {
        while( true ) {
          pLVar11 = (lhs->_M_t).
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
          if (((ulong)*(TokenType *)&pLVar11->input < 0x2d) &&
             ((0x1000001c0006U >> ((ulong)*(TokenType *)&pLVar11->input & 0x3f) & 1) != 0)) break;
          TVar7 = _getOperatorType((Token *)pLVar11);
          local_70._24_2_ = TVar7;
          pmVar8 = std::__detail::
                   _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)OPERATORS_INFO,(key_type *)this_00);
          if (((pmVar8->
               super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>)
               .super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
               super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl != BINARY) ||
             ((bVar2 = (pmVar8->
                       super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>
                       ).super__Head_base<0UL,_unsigned_char,_false>._M_head_impl, bVar2 <= bVar1 &&
              ((bVar2 != bVar1 ||
               ((pmVar8->
                super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>
                ).super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
                super__Tuple_impl<2UL,_pfederc::Associativity>.
                super__Head_base<2UL,_pfederc::Associativity,_false>._M_head_impl != RIGHT))))))
          break;
          local_80 = local_b0;
          local_b0 = (long *)0x0;
          parseBinary(this_00,lhs,(Precedence)&stack0xffffffffffffff80);
          plVar4 = local_b0;
          local_b0 = (long *)local_70._24_8_;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 8))();
          }
          if ((long *)local_80 != (long *)0x0) {
            (**(code **)(*(long *)local_80 + 8))();
          }
          local_80 = 0;
        }
        pEVar12 = (lhs->_M_t).
                  super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        goto LAB_0011046c;
      }
      local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
      local_a8._0_2_ = 2;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)this_00,(SyntaxErrorCode *)local_a8,(Position *)local_70);
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)lhs);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      this_01 = this_00;
LAB_001105c2:
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_01);
LAB_001105c7:
      *(_func_int ***)local_a8._16_8_ = (_func_int **)0x0;
      bVar6 = true;
    }
    else if ((optype == TOK_OP_BRACKET_OPEN) &&
            (bVar6 = Token::operator==((Token *)(lhs->_M_t).
                                                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                                .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                                _M_head_impl[3].lexer,TOK_BRACKET_CLOSE), bVar6)) {
      pLVar11 = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      pTVar3 = pLVar11->currentToken;
      Lexer::next(pLVar11);
      local_88 = (lhs->_M_t).
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      Position::operator+(&((((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>
                               *)&__args_5->_vptr_Expr)->
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                          &op->pos);
      Position::operator+((Position *)local_70,&pTVar3->pos);
      std::
      make_unique<pfederc::UnOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                ((Lexer *)local_a8,(Position *)local_88,(Token **)this_00,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&op);
      uVar5 = local_a8._0_8_;
      local_a8._0_8_ = (UnOpExpr *)0x0;
      pEVar12 = (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
                 &__args_5->_vptr_Expr)->
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
       &__args_5->_vptr_Expr)->
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)uVar5;
      if (pEVar12 != (Expr *)0x0) {
        (*pEVar12->_vptr_Expr[1])();
      }
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)local_a8)
      ;
      pLVar11 = (lhs->_M_t).
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
      bVar6 = false;
    }
    else {
      parseExpression(this_00,(Precedence)lhs);
      uVar5 = local_70._24_8_;
      plVar4 = local_b0;
      local_70._24_8_ = (long *)0x0;
      local_b0 = (long *)uVar5;
      if ((plVar4 != (long *)0x0) &&
         ((**(code **)(*plVar4 + 8))(), (long *)local_70._24_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_70._24_8_ + 8))();
      }
      if (local_b0 == (long *)0x0) goto LAB_001105c7;
      pmVar10 = std::__detail::
                _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)TOKEN_BRACKETS,&optype);
      bVar6 = expect((Parser *)lhs,*pmVar10);
      if (!bVar6) {
        local_a8._14_2_ = 2;
        __args_2 = (Position *)
                   std::
                   map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                   ::at((map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                         *)STX_ERR_BRACKETS,&optype);
        local_88 = __args_5;
        Position::operator+(&op->pos,(Position *)(local_b0 + 4));
        __args_5 = local_88;
        Position::operator+((Position *)local_70,
                            (Position *)
                            &((lhs->_M_t).
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer)
                             ->filePath);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode_const&,pfederc::Position>
                  ((Level *)local_a8,(SyntaxErrorCode *)(local_a8 + 0xe),__args_2);
        generateError((Parser *)local_40,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)lhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_40);
        this_01 = (Parser *)local_a8;
        goto LAB_001105c2;
      }
      pEVar12 = (lhs->_M_t).
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      pLVar11 = pEVar12[3].lexer;
LAB_0011046c:
      Position::operator+(&((((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>
                               *)&__args_5->_vptr_Expr)->
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                          (Position *)(local_b0 + 4));
      std::
      make_unique<pfederc::BiOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,pfederc::TokenType&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                ((Lexer *)local_70,(Position *)pEVar12,(Token **)this_00,(TokenType *)&op,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&optype,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)__args_5);
      uVar5 = local_70._0_8_;
      local_70._0_8_ = (Expr *)0x0;
      pEVar12 = (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
                 &__args_5->_vptr_Expr)->
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
       &__args_5->_vptr_Expr)->
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)uVar5;
      if (pEVar12 != (Expr *)0x0) {
        (*pEVar12->_vptr_Expr[1])();
      }
      std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)local_70)
      ;
      bVar6 = false;
    }
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 8))();
    }
    if (bVar6) {
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_a8._16_8_;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseBinary(std::unique_ptr<Expr> lhs,
    Precedence minPrecedence) noexcept {
  Precedence prec{0};
  Token *lookahead = lexer.getCurrentToken();
  while (_binary_continue_condition(*lookahead, minPrecedence, prec)) {
    const Token *op = lexer.getCurrentToken();
    TokenType optype = _getOperatorType(*op);
    if (optype != TokenType::TOK_OP_NONE)
      lexer.next(); // advance to next unprocessed token
    
    // ignore newline tokens
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();

    std::unique_ptr<Expr> rhs;
    if (TOKEN_BRACKETS.find(optype) != TOKEN_BRACKETS.end()) {
      if (optype == TokenType::TOK_OP_BRACKET_OPEN
          && *lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
        // empty function call, because ()
        const Token *const closingBracket = lexer.getCurrentToken();
        lexer.next(); // eat )
        lhs = std::make_unique<UnOpExpr>(lexer,
          lhs->getPosition() + op->getPosition() + closingBracket->getPosition(),
          op, std::move(lhs));

        lookahead = lexer.getCurrentToken();

        continue;
      } else {
        rhs = parseExpression();
        if (!rhs)
          return nullptr;

        if (!expect(TOKEN_BRACKETS.at(optype))) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            STX_ERR_BRACKETS.at(optype),
            op->getPosition() + rhs->getPosition() +
            lexer.getCurrentToken()->getPosition()));
          return nullptr;
        }
      }

      lookahead = lexer.getCurrentToken();
    } else {
      rhs = parsePrimary();
      if (!rhs) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_PRIMARY_EXPR, op->getPosition()));
          
        return nullptr;
      }

      // lexer already on unprocessed token
      lookahead = lexer.getCurrentToken();
      Precedence innerPrec{0};
      while (_binary_inner_continue_condition(*lookahead, prec, innerPrec)) {
        rhs = parseBinary(std::move(rhs), innerPrec);
        lookahead = lexer.getCurrentToken();
      }
    }

    lhs = std::make_unique<BiOpExpr>(lexer,
      lhs->getPosition() + rhs->getPosition(),
      op, optype, std::move(lhs), std::move(rhs));
  }

  return lhs;
}